

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::truncated_normal_dist<float>::pdf(truncated_normal_dist<float> *this,result_type_conflict1 x)

{
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar1;
  result_type_conflict1 rVar2;
  float fVar3;
  double dVar4;
  
  rVar1 = param_type::mu(in_RDI);
  rVar2 = param_type::sigma(in_RDI);
  fVar3 = (in_XMM0_Da - rVar1) / rVar2;
  rVar1 = param_type::sigma(in_RDI);
  dVar4 = std::exp((double)(ulong)(uint)((-fVar3 * fVar3) / 2.0));
  return ((0.3989423 / rVar1) * SUB84(dVar4,0)) / (in_RDI->Phi_b - in_RDI->Phi_a);
}

Assistant:

pdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return math::constants<result_type>::one_over_sqrt_2pi / P.sigma() *
             math::exp(-x * x / 2) / (P.Phi_b - P.Phi_a);
    }